

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.hpp
# Opt level: O0

void __thiscall Options::Options(Options *this)

{
  Options *this_local;
  
  this->reversedWidth = 0;
  this->useColorCurve = false;
  this->allowMirroring = false;
  this->allowDedup = false;
  this->columnMajor = false;
  this->verbosity = '\0';
  std::optional<std::filesystem::__cxx11::path>::optional(&this->attrmap);
  (this->baseTileIDs)._M_elems[0] = '\0';
  (this->baseTileIDs)._M_elems[1] = '\0';
  this->palSpecType = NO_SPEC;
  memset(&this->palSpec,0,0x18);
  std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::vector
            (&this->palSpec);
  this->bitDepth = '\x02';
  (this->inputSlice).left = 0;
  (this->inputSlice).top = 0;
  (this->inputSlice).width = 0;
  (this->inputSlice).height = 0;
  (this->maxNbTiles)._M_elems[0] = 0xffff;
  (this->maxNbTiles)._M_elems[1] = 0;
  this->nbPalettes = '\b';
  std::optional<std::filesystem::__cxx11::path>::optional(&this->output);
  std::optional<std::filesystem::__cxx11::path>::optional(&this->palettes);
  std::optional<std::filesystem::__cxx11::path>::optional(&this->palmap);
  this->nbColorsPerPal = '\0';
  std::optional<std::filesystem::__cxx11::path>::optional(&this->tilemap);
  this->trim = 0;
  std::optional<std::filesystem::__cxx11::path>::optional(&this->input);
  this->hasTransparentPixels = false;
  return;
}

Assistant:

bool reverse() const { return reversedWidth != 0; }